

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform01_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::uniform01_dist<long_double>::icdf(uniform01_dist<long_double> *this,result_type_conflict3 x)

{
  result_type_conflict3 *in_RAX;
  int *piVar1;
  undefined2 in_stack_00000010;
  
  if (((longdouble)CONCAT28(in_stack_00000010,x._8_8_) < (longdouble)0) ||
     ((longdouble)1 < (longdouble)CONCAT28(in_stack_00000010,x._8_8_))) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    in_RAX = (result_type_conflict3 *)std::numeric_limits<long_double>::quiet_NaN();
  }
  return in_RAX;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return x;
    }